

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Sweep.c
# Opt level: O3

DdNode * Llb4_Nonlin4SweepBadMonitor(Aig_Man_t *pAig,Vec_Int_t *vOrder,DdManager *dd)

{
  int iVar1;
  abctime aVar2;
  DdNode *pDVar3;
  long lVar4;
  DdNode *f;
  
  aVar2 = dd->TimeStop;
  dd->TimeStop = 0;
  pDVar3 = Cudd_ReadOne(dd);
  Cudd_Ref(pDVar3);
  if (0 < pAig->nTruePos) {
    lVar4 = 0;
    f = pDVar3;
    do {
      if (pAig->vCos->nSize <= lVar4) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar1 = *(int *)((long)pAig->vCos->pArray[lVar4] + 0x24);
      if (((long)iVar1 < 0) || (vOrder->nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      pDVar3 = Cudd_bddIthVar(dd,vOrder->pArray[iVar1]);
      pDVar3 = Cudd_bddAnd(dd,f,(DdNode *)((ulong)pDVar3 ^ 1));
      Cudd_Ref(pDVar3);
      Cudd_RecursiveDeref(dd,f);
      lVar4 = lVar4 + 1;
      f = pDVar3;
    } while (lVar4 < pAig->nTruePos);
  }
  Cudd_Deref(pDVar3);
  dd->TimeStop = aVar2;
  return (DdNode *)((ulong)pDVar3 ^ 1);
}

Assistant:

DdNode * Llb4_Nonlin4SweepBadMonitor( Aig_Man_t * pAig, Vec_Int_t * vOrder, DdManager * dd )
{
    Aig_Obj_t * pObj;
    DdNode * bRes, * bVar, * bTemp;
    int i;
    abctime TimeStop;
    TimeStop = dd->TimeStop;  dd->TimeStop = 0;
    bRes = Cudd_ReadOne( dd );   Cudd_Ref( bRes );
    Saig_ManForEachPo( pAig, pObj, i )
    {
        bVar = Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, pObj) );
        bRes = Cudd_bddAnd( dd, bTemp = bRes, Cudd_Not(bVar) );  Cudd_Ref( bRes );
        Cudd_RecursiveDeref( dd, bTemp );
    }
    Cudd_Deref( bRes );
    dd->TimeStop = TimeStop;
    return Cudd_Not(bRes);
}